

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O3

int find_minlength(pcre2_real_code_8 *re,PCRE2_SPTR8 code,PCRE2_SPTR8 startcode,BOOL utf,
                  recurse_check *recurses,int *countptr,int *backref_cache)

{
  byte *pbVar1;
  PCRE2_UCHAR8 PVar2;
  PCRE2_UCHAR8 PVar3;
  PCRE2_UCHAR8 PVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  recurse_check **pprVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  PCRE2_SPTR8 pPVar15;
  recurse_check *prVar16;
  byte bVar17;
  byte *pbVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint8_t *puVar23;
  byte *pbVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  byte *code_00;
  recurse_check this_recurse;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_48;
  recurse_check local_40;
  
  PVar2 = *code;
  iVar11 = 0;
  if ((byte)(PVar2 + 0x74) < 5) {
switchD_00197602_caseD_62:
    return iVar11;
  }
  uVar6 = re->flags;
  PVar3 = code[1];
  PVar4 = code[2];
  iVar11 = *countptr;
  *countptr = iVar11 + 1;
  if (1000 < iVar11) {
    return -1;
  }
  pbVar18 = code + (ulong)((byte)(PVar2 + 0x77) < 2) * 2 + 3;
  pbVar24 = code + CONCAT11(PVar3,PVar4);
  local_6c = 0xffffffff;
  local_68 = 0;
  local_70 = 0xffffffff;
  local_74 = 0;
  bVar8 = false;
  local_64 = -1;
  iVar26 = 0;
  uVar22 = 0;
LAB_001975d2:
  uVar13 = uVar22;
  code_00 = pbVar18;
  iVar21 = iVar26;
  if (0xfffe < iVar26) {
    iVar21 = 0xffff;
    code_00 = pbVar24;
  }
  uVar25 = (ulong)*code_00;
  iVar11 = -3;
  if (0xaa < uVar25) {
    return -3;
  }
  pbVar18 = code_00;
  iVar26 = iVar21;
  uVar22 = uVar13;
  switch(uVar25) {
  case 0:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
    if ((local_64 < 0) || ((!bVar8 && (iVar21 < local_64)))) {
      local_64 = iVar21;
    }
    if (*code_00 != 0x78) {
      return local_64;
    }
    if (local_64 == 0) {
      return 0;
    }
    pbVar24 = code_00 + (ushort)(*(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8);
    pbVar18 = code_00 + 3;
    bVar8 = false;
    iVar26 = 0;
    goto LAB_001975d2;
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x76:
  case 0x7d:
  case 0x7e:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0xa9:
  case 0xaa:
    break;
  default:
    pbVar18 = code_00 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar25];
    goto LAB_001975d2;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    goto switchD_00197602_caseD_6;
  case 0xf:
  case 0x10:
    code_00 = code_00 + 2;
switchD_00197602_caseD_6:
    pbVar18 = code_00 + 1;
    iVar26 = iVar21 + 1;
    goto LAB_001975d2;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x38:
  case 0x3d:
  case 0x3e:
  case 0x45:
  case 0x4a:
  case 0x4b:
  case 0x52:
    pbVar18 = code_00 + 2;
    iVar26 = iVar21 + 1;
    goto LAB_001975d2;
  case 0x29:
  case 0x36:
  case 0x43:
  case 0x50:
    pbVar18 = code_00 + 4;
    iVar26 = (uint)(ushort)(*(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8) + iVar21;
    goto LAB_001975d2;
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x60:
    bVar17 = code_00[1];
    goto LAB_001977ac;
  case 0x57:
  case 0x58:
  case 0x5f:
    pbVar18 = code_00 + (ulong)((byte)(code_00[1] - 0xf) < 2) * 2 + 2;
    iVar26 = iVar21 + 1;
    goto LAB_001975d2;
  case 0x5b:
  case 0x5c:
  case 0x61:
    bVar17 = code_00[3];
LAB_001977ac:
    code_00 = code_00 + (ulong)((byte)(bVar17 - 0xf) < 2) * 2;
    break;
  case 0x5d:
    pbVar18 = code_00 + (ulong)((byte)(code_00[3] - 0xf) < 2) * 2 + 4;
    iVar26 = (uint)(ushort)(*(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8) + iVar21;
    goto LAB_001975d2;
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0xa8:
    goto switchD_00197602_caseD_62;
  case 0x6e:
  case 0x6f:
    pbVar18 = code_00 + 0x21;
    uVar13 = code_00[0x21] - 0x62;
    if (uVar13 < 0xc) {
      if ((0x533U >> (uVar13 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar13 & 0x1f) & 1) == 0) {
          pbVar18 = code_00 + 0x26;
          iVar26 = (uint)(ushort)(*(ushort *)(code_00 + 0x22) << 8 |
                                 *(ushort *)(code_00 + 0x22) >> 8) + iVar21;
          goto LAB_001975d2;
        }
        iVar21 = iVar21 + 1;
      }
      pbVar18 = code_00 + 0x22;
      iVar26 = iVar21;
      goto LAB_001975d2;
    }
    iVar26 = iVar21 + 1;
    goto LAB_001975d2;
  case 0x71:
  case 0x72:
    bVar17 = code_00[1];
    bVar5 = code_00[2];
    uVar13 = (uint)bVar5 + (uint)bVar17 * 0x100;
    if ((int)uVar13 <= *backref_cache) {
      uVar25 = (ulong)(uint)backref_cache[uVar13];
      lVar20 = 3;
      if (-1 < backref_cache[uVar13]) goto LAB_00197e70;
    }
    uVar25 = 0;
    if ((re->overall_options & 0x200) == 0) {
      pbVar14 = coda__pcre2_find_bracket_8(startcode,utf,uVar13);
      pbVar18 = pbVar14;
      if (pbVar14 == (byte *)0x0) {
        return -2;
      }
      do {
        uVar10 = *(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8;
        pbVar1 = pbVar18 + uVar10;
        pbVar18 = pbVar18 + uVar10;
      } while (*pbVar1 == 0x78);
      if (((uVar6 >> 0x15 & 1) == 0) ||
         (pPVar15 = coda__pcre2_find_bracket_8(pbVar18,utf,uVar13), pPVar15 == (PCRE2_SPTR8)0x0)) {
        if ((code_00 <= pbVar14) || (pbVar18 <= code_00)) {
          prVar16 = recurses;
          if (recurses != (recurse_check *)0x0) {
            do {
              if (prVar16->group == pbVar14) goto LAB_00197cd1;
              pprVar9 = &prVar16->prev;
              prVar16 = *pprVar9;
            } while (*pprVar9 != (recurse_check *)0x0);
          }
          local_40.prev = recurses;
          local_40.group = pbVar14;
          uVar12 = find_minlength(re,pbVar14,startcode,utf,&local_40,countptr,backref_cache);
          uVar25 = (ulong)uVar12;
          if ((int)uVar12 < 0) {
            return uVar12;
          }
          goto LAB_00197e09;
        }
LAB_00197cd1:
        bVar8 = true;
      }
      uVar25 = 0;
    }
LAB_00197e09:
    backref_cache[uVar13] = (int)uVar25;
    iVar11 = *backref_cache;
    if (iVar11 + 1 < (int)uVar13) {
      memset(backref_cache + (long)iVar11 + 1,0xff,
             (ulong)((((uint)bVar17 * 0x100 + (uint)bVar5) - iVar11) - 2) * 4 + 4);
    }
    *backref_cache = uVar13;
    lVar20 = 3;
    goto LAB_00197e70;
  case 0x73:
  case 0x74:
    uVar25 = 0;
    lVar20 = 5;
    if (((uVar6 >> 0x15 & 1) == 0) && ((re->overall_options & 0x200) == 0)) {
      uVar10 = *(ushort *)(code_00 + 3) << 8 | *(ushort *)(code_00 + 3) >> 8;
      if (uVar10 == 0) {
        uVar25 = 0x7fffffff;
      }
      else {
        puVar23 = re[1].start_bitmap +
                  (ulong)re->name_entry_size *
                  (ulong)(ushort)(*(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8) +
                  -0x28;
        uVar13 = *backref_cache;
        uVar25 = 0x7fffffff;
        uVar12 = (uint)uVar10;
        do {
          bVar17 = *puVar23;
          bVar5 = puVar23[1];
          uVar19 = (uint)bVar17 * 0x100 + (uint)bVar5;
          if (((int)uVar13 < (int)uVar19) || (uVar27 = backref_cache[uVar19], (int)uVar27 < 0)) {
            pbVar14 = coda__pcre2_find_bracket_8(startcode,utf,uVar19);
            pbVar18 = pbVar14;
            if (pbVar14 == (byte *)0x0) {
              return -2;
            }
            do {
              uVar10 = *(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8;
              pbVar1 = pbVar18 + uVar10;
              pbVar18 = pbVar18 + uVar10;
            } while (*pbVar1 == 0x78);
            uVar27 = 0;
            if ((pbVar14 < code_00) && (code_00 < pbVar18)) {
LAB_00197903:
              bVar8 = true;
            }
            else {
              prVar16 = recurses;
              if (recurses != (recurse_check *)0x0) {
                do {
                  if (prVar16->group == pbVar14) goto LAB_00197903;
                  pprVar9 = &prVar16->prev;
                  prVar16 = *pprVar9;
                } while (*pprVar9 != (recurse_check *)0x0);
              }
              local_40.prev = recurses;
              local_40.group = pbVar14;
              uVar27 = find_minlength(re,pbVar14,startcode,utf,&local_40,countptr,backref_cache);
              if ((int)uVar27 < 0) {
                return uVar27;
              }
            }
            backref_cache[uVar19] = uVar27;
            iVar11 = *backref_cache;
            if (iVar11 + 1 < (int)uVar19) {
              local_48 = (uint)bVar5;
              memset(backref_cache + (long)iVar11 + 1,0xff,
                     (ulong)((((uint)bVar17 * 0x100 + local_48) - iVar11) - 2) * 4 + 4);
            }
            *backref_cache = uVar19;
            uVar13 = uVar19;
          }
          uVar19 = (uint)uVar25;
          if ((int)uVar27 < (int)(uint)uVar25) {
            uVar19 = uVar27;
          }
          uVar25 = (ulong)uVar19;
          if (uVar27 == 0) break;
          puVar23 = puVar23 + re->name_entry_size;
          bVar7 = 1 < (int)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar7);
        lVar20 = 5;
      }
    }
LAB_00197e70:
    pbVar18 = code_00 + lVar20;
    uVar12 = 1;
    uVar13 = code_00[lVar20] - 0x62;
    if (uVar13 < 0xc) {
      if ((0x533U >> (uVar13 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar13 & 0x1f) & 1) == 0) {
          uVar12 = (uint)(ushort)(*(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8);
          pbVar18 = pbVar18 + 5;
        }
        else {
          pbVar18 = pbVar18 + 1;
        }
      }
      else {
        pbVar18 = pbVar18 + 1;
        uVar12 = 0;
      }
    }
    if (((int)uVar25 < 1) || (iVar26 = 0xffff, uVar12 <= (uint)(0x7fffffff / uVar25))) {
      iVar11 = uVar12 * (int)uVar25;
      iVar26 = iVar21 + iVar11;
      if (0xffff - iVar21 < iVar11) {
        iVar26 = 0xffff;
      }
    }
    goto LAB_001975d2;
  case 0x75:
    uVar25 = (ulong)(ushort)(*(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8);
    pbVar18 = startcode + uVar25;
    uVar22 = (uint)(ushort)(*(ushort *)(startcode + uVar25 + 3) << 8 |
                           *(ushort *)(startcode + uVar25 + 3) >> 8);
    pbVar14 = pbVar18;
    if (uVar22 == local_70) {
      iVar21 = iVar21 + local_74;
    }
    else {
      do {
        uVar10 = *(ushort *)(pbVar14 + 1) << 8 | *(ushort *)(pbVar14 + 1) >> 8;
        pbVar1 = pbVar14 + uVar10;
        pbVar14 = pbVar14 + uVar10;
      } while (*pbVar1 == 0x78);
      if ((pbVar18 < code_00) && (code_00 < pbVar14)) {
LAB_00197bd4:
        bVar8 = true;
      }
      else {
        prVar16 = recurses;
        if (recurses != (recurse_check *)0x0) {
          do {
            if (prVar16->group == pbVar18) goto LAB_00197bd4;
            pprVar9 = &prVar16->prev;
            prVar16 = *pprVar9;
          } while (*pprVar9 != (recurse_check *)0x0);
        }
        local_40.prev = recurses;
        local_40.group = pbVar18;
        local_74 = find_minlength(re,pbVar18,startcode,utf,&local_40,countptr,backref_cache);
        if (local_74 < 0) {
          return local_74;
        }
        iVar21 = iVar21 + local_74;
        local_70 = uVar22;
      }
    }
    pbVar18 = code_00 + (ulong)uVar13 + 3;
    iVar26 = iVar21;
    uVar22 = 0;
    goto LAB_001975d2;
  case 0x77:
    pbVar18 = code_00 + (ushort)(*(ushort *)(code_00 + 5) << 8 | *(ushort *)(code_00 + 5) >> 8);
    goto LAB_001975d2;
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
    do {
      uVar10 = *(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8;
      code_00 = pbVar18 + uVar10;
      pbVar14 = pbVar18 + uVar10;
      uVar25 = (ulong)*pbVar14;
      pbVar18 = code_00;
    } while (*pbVar14 == 0x78);
    break;
  case 0x85:
  case 0x86:
  case 0x88:
  case 0x8c:
  case 0x8d:
    goto switchD_00197602_caseD_85;
  case 0x87:
    if (code_00[3] == 0x75) {
      pbVar18 = code_00 + 3;
      uVar22 = 3;
      if (code_00[6] != 0x79) goto switchD_00197602_caseD_85;
      goto LAB_001975d2;
    }
    goto switchD_00197602_caseD_85;
  case 0x89:
  case 0x8a:
  case 0x8e:
  case 0x8f:
    uVar13 = (uint)(ushort)(*(ushort *)(code_00 + 3) << 8 | *(ushort *)(code_00 + 3) >> 8);
    if ((((uVar6 >> 0x15 & 1) != 0) || (uVar13 != local_6c)) &&
       (local_68 = find_minlength(re,code_00,startcode,utf,recurses,countptr,backref_cache),
       local_6c = uVar13, local_68 < 0)) {
      return local_68;
    }
    do {
      uVar10 = *(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8;
      pbVar18 = code_00 + uVar10;
      code_00 = code_00 + uVar10;
    } while (*pbVar18 == 0x78);
    iVar21 = iVar21 + local_68;
    goto LAB_001977ee;
  case 0x8b:
  case 0x90:
    uVar10 = *(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8;
    if (code_00[uVar10] != 0x78) {
      code_00 = code_00 + uVar10;
      goto LAB_001977ee;
    }
switchD_00197602_caseD_85:
    iVar11 = find_minlength(re,code_00,startcode,utf,recurses,countptr,backref_cache);
    if (iVar11 < 0) {
      return iVar11;
    }
    do {
      uVar10 = *(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8;
      pbVar18 = code_00 + uVar10;
      code_00 = code_00 + uVar10;
    } while (*pbVar18 == 0x78);
    pbVar18 = code_00 + 3;
    iVar26 = iVar11 + iVar21;
    uVar22 = uVar13;
    goto LAB_001975d2;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0xa7:
    code_00 = code_00 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar25];
    do {
      uVar10 = *(ushort *)(code_00 + 1) << 8 | *(ushort *)(code_00 + 1) >> 8;
      pbVar18 = code_00 + uVar10;
      code_00 = code_00 + uVar10;
    } while (*pbVar18 == 0x78);
LAB_001977ee:
    pbVar18 = code_00 + 3;
    iVar26 = iVar21;
    goto LAB_001975d2;
  case 0x9a:
  case 0x9c:
  case 0x9e:
  case 0xa0:
  case 0xa2:
    goto switchD_00197602_caseD_9a;
  case 0xa4:
  case 0xa5:
    return -1;
  }
  pbVar18 = code_00 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                      [uVar25];
  goto LAB_001975d2;
switchD_00197602_caseD_9a:
  pbVar18 = code_00 + (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                             [uVar25] + (ulong)code_00[1];
  goto LAB_001975d2;
}

Assistant:

static int
find_minlength(const pcre2_real_code *re, PCRE2_SPTR code,
  PCRE2_SPTR startcode, BOOL utf, recurse_check *recurses, int *countptr,
  int *backref_cache)
{
int length = -1;
int branchlength = 0;
int prev_cap_recno = -1;
int prev_cap_d = 0;
int prev_recurse_recno = -1;
int prev_recurse_d = 0;
uint32_t once_fudge = 0;
BOOL had_recurse = FALSE;
BOOL dupcapused = (re->flags & PCRE2_DUPCAPUSED) != 0;
PCRE2_SPTR nextbranch = code + GET(code, 1);
PCRE2_UCHAR *cc = (PCRE2_UCHAR *)code + 1 + LINK_SIZE;
recurse_check this_recurse;

/* If this is a "could be empty" group, its minimum length is 0. */

if (*code >= OP_SBRA && *code <= OP_SCOND) return 0;

/* Skip over capturing bracket number */

if (*code == OP_CBRA || *code == OP_CBRAPOS) cc += IMM2_SIZE;

/* A large and/or complex regex can take too long to process. */

if ((*countptr)++ > 1000) return -1;

/* Scan along the opcodes for this branch. If we get to the end of the branch,
check the length against that of the other branches. If the accumulated length
passes 16-bits, reset to that value and skip the rest of the branch. */

for (;;)
  {
  int d, min, recno;
  PCRE2_UCHAR op, *cs, *ce;

  if (branchlength >= UINT16_MAX)
    {
    branchlength = UINT16_MAX;
    cc = (PCRE2_UCHAR *)nextbranch;
    }

  op = *cc;
  switch (op)
    {
    case OP_COND:
    case OP_SCOND:

    /* If there is only one branch in a condition, the implied branch has zero
    length, so we don't add anything. This covers the DEFINE "condition"
    automatically. If there are two branches we can treat it the same as any
    other non-capturing subpattern. */

    cs = cc + GET(cc, 1);
    if (*cs != OP_ALT)
      {
      cc = cs + 1 + LINK_SIZE;
      break;
      }
    goto PROCESS_NON_CAPTURE;

    case OP_BRA:
    /* There's a special case of OP_BRA, when it is wrapped round a repeated
    OP_RECURSE. We'd like to process the latter at this level so that
    remembering the value works for repeated cases. So we do nothing, but
    set a fudge value to skip over the OP_KET after the recurse. */

    if (cc[1+LINK_SIZE] == OP_RECURSE && cc[2*(1+LINK_SIZE)] == OP_KET)
      {
      once_fudge = 1 + LINK_SIZE;
      cc += 1 + LINK_SIZE;
      break;
      }
    /* Fall through */

    case OP_ONCE:
    case OP_SCRIPT_RUN:
    case OP_SBRA:
    case OP_BRAPOS:
    case OP_SBRAPOS:
    PROCESS_NON_CAPTURE:
    d = find_minlength(re, cc, startcode, utf, recurses, countptr,
      backref_cache);
    if (d < 0) return d;
    branchlength += d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* To save time for repeated capturing subpatterns, we remember the
    length of the previous one. Unfortunately we can't do the same for
    the unnumbered ones above. Nor can we do this if (?| is present in the
    pattern because captures with the same number are not then identical. */

    case OP_CBRA:
    case OP_SCBRA:
    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    recno = (int)GET2(cc, 1+LINK_SIZE);
    if (dupcapused || recno != prev_cap_recno)
      {
      prev_cap_recno = recno;
      prev_cap_d = find_minlength(re, cc, startcode, utf, recurses, countptr,
        backref_cache);
      if (prev_cap_d < 0) return prev_cap_d;
      }
    branchlength += prev_cap_d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* ACCEPT makes things far too complicated; we have to give up. In fact,
    from 10.34 onwards, if a pattern contains (*ACCEPT), this function is not
    used. However, leave the code in place, just in case. */

    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    return -1;

    /* Reached end of a branch; if it's a ket it is the end of a nested
    call. If it's ALT it is an alternation in a nested call. If it is END it's
    the end of the outer call. All can be handled by the same code. If the
    length of any branch is zero, there is no need to scan any subsequent
    branches. */

    case OP_ALT:
    case OP_KET:
    case OP_KETRMAX:
    case OP_KETRMIN:
    case OP_KETRPOS:
    case OP_END:
    if (length < 0 || (!had_recurse && branchlength < length))
      length = branchlength;
    if (op != OP_ALT || length == 0) return length;
    nextbranch = cc + GET(cc, 1);
    cc += 1 + LINK_SIZE;
    branchlength = 0;
    had_recurse = FALSE;
    break;

    /* Skip over assertive subpatterns */

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ASSERT_NA:
    case OP_ASSERTBACK_NA:
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    /* Fall through */

    /* Skip over things that don't match chars */

    case OP_REVERSE:
    case OP_VREVERSE:
    case OP_CREF:
    case OP_DNCREF:
    case OP_RREF:
    case OP_DNRREF:
    case OP_FALSE:
    case OP_TRUE:
    case OP_CALLOUT:
    case OP_SOD:
    case OP_SOM:
    case OP_EOD:
    case OP_EODN:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_NOT_UCP_WORD_BOUNDARY:
    case OP_UCP_WORD_BOUNDARY:
    cc += PRIV(OP_lengths)[*cc];
    break;

    case OP_CALLOUT_STR:
    cc += GET(cc, 1 + 2*LINK_SIZE);
    break;

    /* Skip over a subpattern that has a {0} or {0,x} quantifier */

    case OP_BRAZERO:
    case OP_BRAMINZERO:
    case OP_BRAPOSZERO:
    case OP_SKIPZERO:
    cc += PRIV(OP_lengths)[*cc];
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* Handle literal characters and + repetitions */

    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_PLUS:
    case OP_PLUSI:
    case OP_MINPLUS:
    case OP_MINPLUSI:
    case OP_POSPLUS:
    case OP_POSPLUSI:
    case OP_NOTPLUS:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUS:
    case OP_NOTMINPLUSI:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSPLUSI:
    branchlength++;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEPOSPLUS:
    branchlength++;
    cc += (cc[1] == OP_PROP || cc[1] == OP_NOTPROP)? 4 : 2;
    break;

    /* Handle exact repetitions. The count is already in characters, but we
    may need to skip over a multibyte character in UTF mode.  */

    case OP_EXACT:
    case OP_EXACTI:
    case OP_NOTEXACT:
    case OP_NOTEXACTI:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEEXACT:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE + ((cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP)? 2 : 0);
    break;

    /* Handle single-char non-literal matchers */

    case OP_PROP:
    case OP_NOTPROP:
    cc += 2;
    /* Fall through */

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_EXTUNI:
    case OP_HSPACE:
    case OP_NOT_HSPACE:
    case OP_VSPACE:
    case OP_NOT_VSPACE:
    branchlength++;
    cc++;
    break;

    /* "Any newline" might match two characters, but it also might match just
    one. */

    case OP_ANYNL:
    branchlength += 1;
    cc++;
    break;

    /* The single-byte matcher means we can't proceed in UTF mode. (In
    non-UTF mode \C will actually be turned into OP_ALLANY, so won't ever
    appear, but leave the code, just in case.) */

    case OP_ANYBYTE:
#ifdef SUPPORT_UNICODE
    if (utf) return -1;
#endif
    branchlength++;
    cc++;
    break;

    /* For repeated character types, we have to test for \p and \P, which have
    an extra two bytes of parameters. */

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSQUERY:
    if (cc[1] == OP_PROP || cc[1] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEPOSUPTO:
    if (cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    /* Check a class for variable quantification */

    case OP_CLASS:
    case OP_NCLASS:
#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    /* The original code caused an unsigned overflow in 64 bit systems,
    so now we use a conditional statement. */
    if (op == OP_XCLASS)
      cc += GET(cc, 1);
    else
      cc += PRIV(OP_lengths)[OP_CLASS];
#else
    cc += PRIV(OP_lengths)[OP_CLASS];
#endif

    switch (*cc)
      {
      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      branchlength++;
      /* Fall through */

      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      branchlength += GET2(cc,1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      branchlength++;
      break;
      }
    break;

    /* Backreferences and subroutine calls (OP_RECURSE) are treated in the same
    way: we find the minimum length for the subpattern. A recursion
    (backreference or subroutine) causes an a flag to be set that causes the
    length of this branch to be ignored. The logic is that a recursion can only
    make sense if there is another alternative that stops the recursing. That
    will provide the minimum length (when no recursion happens).

    If PCRE2_MATCH_UNSET_BACKREF is set, a backreference to an unset bracket
    matches an empty string (by default it causes a matching failure), so in
    that case we must set the minimum length to zero.

    For backreferenes, if duplicate numbers are present in the pattern we check
    for a reference to a duplicate. If it is, we don't know which version will
    be referenced, so we have to set the minimum length to zero. */

    /* Duplicate named pattern back reference. */

    case OP_DNREF:
    case OP_DNREFI:
    if (!dupcapused && (re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
      {
      int count = GET2(cc, 1+IMM2_SIZE);
      PCRE2_UCHAR *slot =
        (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
          GET2(cc, 1) * re->name_entry_size;

      d = INT_MAX;

      /* Scan all groups with the same name; find the shortest. */

      while (count-- > 0)
        {
        int dd, i;
        recno = GET2(slot, 0);

        if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
          dd = backref_cache[recno];
        else
          {
          ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
          if (cs == NULL) return -2;
          do ce += GET(ce, 1); while (*ce == OP_ALT);

          dd = 0;
          if (!dupcapused ||
              (PCRE2_UCHAR *)PRIV(find_bracket)(ce, utf, recno) == NULL)
            {
            if (cc > cs && cc < ce)    /* Simple recursion */
              {
              had_recurse = TRUE;
              }
            else
              {
              recurse_check *r = recurses;
              for (r = recurses; r != NULL; r = r->prev)
                if (r->group == cs) break;
              if (r != NULL)           /* Mutual recursion */
                {
                had_recurse = TRUE;
                }
              else
                {
                this_recurse.prev = recurses;  /* No recursion */
                this_recurse.group = cs;
                dd = find_minlength(re, cs, startcode, utf, &this_recurse,
                  countptr, backref_cache);
                if (dd < 0) return dd;
                }
              }
            }

          backref_cache[recno] = dd;
          for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
          backref_cache[0] = recno;
          }

        if (dd < d) d = dd;
        if (d <= 0) break;    /* No point looking at any more */
        slot += re->name_entry_size;
        }
      }
    else d = 0;
    cc += 1 + 2*IMM2_SIZE;
    goto REPEAT_BACK_REFERENCE;

    /* Single back reference by number. References by name are converted to by
    number when there is no duplication. */

    case OP_REF:
    case OP_REFI:
    recno = GET2(cc, 1);
    if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
      d = backref_cache[recno];
    else
      {
      int i;
      d = 0;

      if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
        {
        ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
        if (cs == NULL) return -2;
        do ce += GET(ce, 1); while (*ce == OP_ALT);

        if (!dupcapused ||
            (PCRE2_UCHAR *)PRIV(find_bracket)(ce, utf, recno) == NULL)
          {
          if (cc > cs && cc < ce)    /* Simple recursion */
            {
            had_recurse = TRUE;
            }
          else
            {
            recurse_check *r = recurses;
            for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
            if (r != NULL)           /* Mutual recursion */
              {
              had_recurse = TRUE;
              }
            else                     /* No recursion */
              {
              this_recurse.prev = recurses;
              this_recurse.group = cs;
              d = find_minlength(re, cs, startcode, utf, &this_recurse, countptr,
                backref_cache);
              if (d < 0) return d;
              }
            }
          }
        }

      backref_cache[recno] = d;
      for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
      backref_cache[0] = recno;
      }

    cc += 1 + IMM2_SIZE;

    /* Handle repeated back references */

    REPEAT_BACK_REFERENCE:
    switch (*cc)
      {
      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      min = 0;
      cc++;
      break;

      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      min = 1;
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      min = GET2(cc, 1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      min = 1;
      break;
      }

     /* Take care not to overflow: (1) min and d are ints, so check that their
     product is not greater than INT_MAX. (2) branchlength is limited to
     UINT16_MAX (checked at the top of the loop). */

    if ((d > 0 && (INT_MAX/d) < min) || UINT16_MAX - branchlength < min*d)
      branchlength = UINT16_MAX;
    else branchlength += min * d;
    break;

    /* Recursion always refers to the first occurrence of a subpattern with a
    given number. Therefore, we can always make use of caching, even when the
    pattern contains multiple subpatterns with the same number. */

    case OP_RECURSE:
    cs = ce = (PCRE2_UCHAR *)startcode + GET(cc, 1);
    recno = GET2(cs, 1+LINK_SIZE);
    if (recno == prev_recurse_recno)
      {
      branchlength += prev_recurse_d;
      }
    else
      {
      do ce += GET(ce, 1); while (*ce == OP_ALT);
      if (cc > cs && cc < ce)    /* Simple recursion */
        had_recurse = TRUE;
      else
        {
        recurse_check *r = recurses;
        for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
        if (r != NULL)          /* Mutual recursion */
          had_recurse = TRUE;
        else
          {
          this_recurse.prev = recurses;
          this_recurse.group = cs;
          prev_recurse_d = find_minlength(re, cs, startcode, utf, &this_recurse,
            countptr, backref_cache);
          if (prev_recurse_d < 0) return prev_recurse_d;
          prev_recurse_recno = recno;
          branchlength += prev_recurse_d;
          }
        }
      }
    cc += 1 + LINK_SIZE + once_fudge;
    once_fudge = 0;
    break;

    /* Anything else does not or need not match a character. We can get the
    item's length from the table, but for those that can match zero occurrences
    of a character, we must take special action for UTF-8 characters. As it
    happens, the "NOT" versions of these opcodes are used at present only for
    ASCII characters, so they could be omitted from this list. However, in
    future that may change, so we include them here so as not to leave a
    gotcha for a future maintainer. */

    case OP_UPTO:
    case OP_UPTOI:
    case OP_NOTUPTO:
    case OP_NOTUPTOI:
    case OP_MINUPTO:
    case OP_MINUPTOI:
    case OP_NOTMINUPTO:
    case OP_NOTMINUPTOI:
    case OP_POSUPTO:
    case OP_POSUPTOI:
    case OP_NOTPOSUPTO:
    case OP_NOTPOSUPTOI:

    case OP_STAR:
    case OP_STARI:
    case OP_NOTSTAR:
    case OP_NOTSTARI:
    case OP_MINSTAR:
    case OP_MINSTARI:
    case OP_NOTMINSTAR:
    case OP_NOTMINSTARI:
    case OP_POSSTAR:
    case OP_POSSTARI:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSSTARI:

    case OP_QUERY:
    case OP_QUERYI:
    case OP_NOTQUERY:
    case OP_NOTQUERYI:
    case OP_MINQUERY:
    case OP_MINQUERYI:
    case OP_NOTMINQUERY:
    case OP_NOTMINQUERYI:
    case OP_POSQUERY:
    case OP_POSQUERYI:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSQUERYI:

    cc += PRIV(OP_lengths)[op];
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    /* Skip these, but we need to add in the name length. */

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    cc += PRIV(OP_lengths)[op] + cc[1];
    break;

    /* The remaining opcodes are just skipped over. */

    case OP_CLOSE:
    case OP_COMMIT:
    case OP_FAIL:
    case OP_PRUNE:
    case OP_SET_SOM:
    case OP_SKIP:
    case OP_THEN:
    cc += PRIV(OP_lengths)[op];
    break;

    /* This should not occur: we list all opcodes explicitly so that when
    new ones get added they are properly considered. */

    default:
    return -3;
    }
  }
/* Control never gets here */
}